

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O3

int __thiscall ncnn::Proposal::load_param(Proposal *this,ParamDict *pd)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Allocator *pAVar4;
  int iVar5;
  float *pfVar6;
  int *piVar7;
  ulong uVar8;
  long lVar9;
  float *pfVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  Mat local_b8;
  void *local_68;
  long local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  iVar5 = ParamDict::get(pd,0,0x10);
  this->feat_stride = iVar5;
  iVar5 = ParamDict::get(pd,1,0x10);
  this->base_size = iVar5;
  iVar5 = ParamDict::get(pd,2,6000);
  this->pre_nms_topN = iVar5;
  iVar5 = ParamDict::get(pd,3,300);
  this->after_nms_topN = iVar5;
  fVar12 = ParamDict::get(pd,4,0.7);
  this->nms_thresh = fVar12;
  iVar5 = ParamDict::get(pd,5,0x10);
  this->min_size = iVar5;
  iVar5 = this->base_size;
  uVar1 = (this->ratios).w;
  uVar2 = (this->scales).w;
  local_b8.cstep = 0;
  local_b8.data = (float *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  Mat::create(&local_b8,4,uVar2 * uVar1,4,(Allocator *)0x0);
  if (0 < (int)uVar1) {
    local_58 = (float)iVar5 * 0.5;
    local_68 = (this->ratios).data;
    pvVar3 = (this->scales).data;
    lVar9 = (long)local_b8.w * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
    local_60 = lVar9 * (ulong)uVar2;
    uVar11 = 0;
    pfVar10 = (float *)local_b8.data;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    do {
      if (0 < (int)uVar2) {
        fVar12 = *(float *)((long)local_68 + uVar11 * 4);
        fVar13 = roundf((float)iVar5 / SQRT(fVar12));
        local_48 = (float)(int)fVar13;
        fStack_44 = (float)(int)extraout_XMM0_Db;
        fStack_40 = (float)(int)extraout_XMM0_Dc;
        fStack_3c = (float)(int)extraout_XMM0_Dd;
        fVar12 = roundf(fVar12 * local_48);
        uVar8 = 0;
        pfVar6 = pfVar10;
        do {
          fVar13 = *(float *)((long)pvVar3 + uVar8 * 4) * 0.5;
          fVar14 = fVar13 * local_48;
          fVar13 = fVar13 * (float)(int)fVar12;
          *pfVar6 = local_58 - fVar14;
          pfVar6[1] = fStack_54 - fVar13;
          pfVar6[2] = fVar14 + fStack_50;
          pfVar6[3] = fVar13 + fStack_4c;
          uVar8 = uVar8 + 1;
          pfVar6 = (float *)((long)pfVar6 + lVar9);
        } while (uVar2 != uVar8);
      }
      uVar11 = uVar11 + 1;
      pfVar10 = (float *)((long)pfVar10 + local_60);
    } while (uVar11 != uVar1);
  }
  piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (&this->anchors != &local_b8) {
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    piVar7 = (this->anchors).refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        pvVar3 = (this->anchors).data;
        pAVar4 = (this->anchors).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->anchors).data = local_b8.data;
    piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    (this->anchors).refcount = piVar7;
    (this->anchors).elemsize = CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
    (this->anchors).elempack = local_b8.elempack;
    (this->anchors).allocator = local_b8.allocator;
    (this->anchors).dims = local_b8.dims;
    (this->anchors).w = local_b8.w;
    (this->anchors).h = local_b8.h;
    (this->anchors).d = local_b8.d;
    (this->anchors).c = local_b8.c;
    (this->anchors).cstep = local_b8.cstep;
  }
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if ((float *)local_b8.data != (float *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int Proposal::load_param(const ParamDict& pd)
{
    feat_stride = pd.get(0, 16);
    base_size = pd.get(1, 16);
    pre_nms_topN = pd.get(2, 6000);
    after_nms_topN = pd.get(3, 300);
    nms_thresh = pd.get(4, 0.7f);
    min_size = pd.get(5, 16);

    //     Mat ratio;
    //     Mat scale;

    anchors = generate_anchors(base_size, ratios, scales);

    return 0;
}